

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::StructDatePart::Bind
          (ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  LogicalTypeId LVar1;
  bool bVar2;
  uint uVar3;
  pointer pEVar4;
  undefined8 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  LogicalType *this;
  string *msg;
  long in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> in_RDI;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar7;
  LogicalTypeId part_type;
  DatePartSpecifier part_code;
  string part_name;
  Value *part_value;
  const_iterator __end3;
  const_iterator __begin3;
  vector<duckdb::Value,_true> *__range3;
  vector<duckdb::Value,_true> *list_children;
  Value parts_list;
  part_codes_t part_codes;
  child_list_t<LogicalType> struct_children;
  case_insensitive_set_t name_collision_set;
  LogicalType *in_stack_fffffffffffffbd8;
  SimpleFunction *in_stack_fffffffffffffbe0;
  Value *this_00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalTypeId>
  *in_stack_fffffffffffffbe8;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffbf0;
  allocator *paVar8;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  in_stack_fffffffffffffc00;
  LogicalType *in_stack_fffffffffffffc08;
  undefined7 in_stack_fffffffffffffc20;
  undefined1 in_stack_fffffffffffffc27;
  pointer in_stack_fffffffffffffc28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc40;
  string *in_stack_fffffffffffffc48;
  BinderException *in_stack_fffffffffffffc50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1;
  Value *in_stack_fffffffffffffc78;
  LogicalType *in_stack_fffffffffffffc80;
  string *in_stack_fffffffffffffc88;
  undefined1 in_stack_fffffffffffffcbf;
  Expression *in_stack_fffffffffffffcc0;
  ClientContext *in_stack_fffffffffffffcc8;
  string local_320 [39];
  allocator local_2f9;
  string local_2f8 [79];
  char local_2a9;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_2a8;
  undefined1 local_2a0;
  undefined1 local_291;
  string local_290 [32];
  string local_270 [39];
  allocator local_249;
  string local_248 [32];
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_228;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_220;
  DatePartSpecifier local_211;
  string local_210 [39];
  undefined1 local_1e9;
  string local_1e8 [39];
  undefined1 local_1c1 [33];
  reference local_1a0;
  Value *local_198;
  __normal_iterator<const_duckdb::Value_*,_std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>_>
  local_190;
  vector<duckdb::Value,_true> *local_188;
  undefined1 local_179;
  string local_178 [39];
  allocator local_151;
  string local_150 [32];
  vector<duckdb::Value,_true> *local_130;
  Value local_128 [2];
  undefined1 local_79;
  string local_78 [39];
  allocator local_51;
  string local_50 [56];
  long local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffbe0,(size_type)in_stack_fffffffffffffbd8);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffbe0);
  uVar3 = (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[6])();
  if ((uVar3 & 1) != 0) {
    uVar5 = __cxa_allocate_exception(0x10);
    ParameterNotResolvedException::ParameterNotResolvedException
              ((ParameterNotResolvedException *)
               CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
    __cxa_throw(uVar5,&ParameterNotResolvedException::typeinfo,
                ParameterNotResolvedException::~ParameterNotResolvedException);
  }
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffbe0,(size_type)in_stack_fffffffffffffbd8);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffbe0);
  uVar3 = (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[0xf])();
  if ((uVar3 & 1) == 0) {
    local_79 = 1;
    uVar5 = __cxa_allocate_exception(0x10);
    paVar8 = &local_51;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_50,"%s can only take constant lists of part names",paVar8);
    ::std::__cxx11::string::string(local_78,(string *)(local_18 + 8));
    BinderException::BinderException<std::__cxx11::string>
              (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    local_79 = 0;
    __cxa_throw(uVar5,&BinderException::typeinfo,BinderException::~BinderException);
  }
  ::std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x1ff3c1d);
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
            *)0x1ff3c2a);
  vector<duckdb::DatePartSpecifier,_true>::vector
            ((vector<duckdb::DatePartSpecifier,_true> *)0x1ff3c37);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                         *)in_stack_fffffffffffffbe0,(size_type)in_stack_fffffffffffffbd8);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffbe0);
  ExpressionExecutor::EvaluateScalar
            (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,(bool)in_stack_fffffffffffffcbf);
  this = Value::type(local_128);
  LVar1 = LogicalType::id(this);
  if (LVar1 != LIST) {
    uVar5 = __cxa_allocate_exception(0x10);
    paVar8 = &local_2f9;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_2f8,"%s can only take constant lists of part names",paVar8)
    ;
    ::std::__cxx11::string::string(local_320,(string *)(local_18 + 8));
    BinderException::BinderException<std::__cxx11::string>
              (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    __cxa_throw(uVar5,&BinderException::typeinfo,BinderException::~BinderException);
  }
  local_130 = ListValue::GetChildren
                        ((Value *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
  bVar2 = ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::empty
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                     in_stack_fffffffffffffbf0);
  if (!bVar2) {
    local_188 = local_130;
    local_190._M_current =
         (Value *)::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::begin
                            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                             in_stack_fffffffffffffbd8);
    local_198 = (Value *)::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::end
                                   ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                                    in_stack_fffffffffffffbd8);
    params_1 = local_10;
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_duckdb::Value_*,_std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>_>
                          *)in_stack_fffffffffffffbe0,
                         (__normal_iterator<const_duckdb::Value_*,_std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>_>
                          *)in_stack_fffffffffffffbd8);
      if (!bVar2) {
        Function::EraseArgument
                  (in_stack_fffffffffffffbe0,
                   (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)in_stack_fffffffffffffbd8,0x1ff4474);
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
        ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                  *)in_stack_fffffffffffffbe0,
                 (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                  *)in_stack_fffffffffffffbd8);
        LogicalType::STRUCT((child_list_t<LogicalType> *)in_stack_fffffffffffffc28);
        this_00 = (Value *)&stack0xfffffffffffffcc0;
        LogicalType::operator=((LogicalType *)this_00,in_stack_fffffffffffffbd8);
        LogicalType::~LogicalType((LogicalType *)0x1ff44cf);
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                   *)0x1ff44dc);
        make_uniq<duckdb::StructDatePart::BindData,duckdb::LogicalType&,duckdb::vector<duckdb::DatePartSpecifier,true>&>
                  (in_stack_fffffffffffffc08,
                   (vector<duckdb::DatePartSpecifier,_true> *)in_stack_fffffffffffffc00._M_cur);
        unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
        unique_ptr<duckdb::StructDatePart::BindData,std::default_delete<duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::unique_ptr>,void>
                  ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                    *)this_00,
                   (unique_ptr<duckdb::StructDatePart::BindData,_std::default_delete<duckdb::StructDatePart::BindData>_>
                    *)in_stack_fffffffffffffbd8);
        unique_ptr<duckdb::StructDatePart::BindData,_std::default_delete<duckdb::StructDatePart::BindData>,_true>
        ::~unique_ptr((unique_ptr<duckdb::StructDatePart::BindData,_std::default_delete<duckdb::StructDatePart::BindData>,_true>
                       *)0x1ff4524);
        Value::~Value(this_00);
        vector<duckdb::DatePartSpecifier,_true>::~vector
                  ((vector<duckdb::DatePartSpecifier,_true> *)0x1ff453e);
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                   *)0x1ff454b);
        ::std::
        unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)0x1ff4558);
        return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
               (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
               in_RDI._M_t.
               super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
               .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
      }
      local_1a0 = __gnu_cxx::
                  __normal_iterator<const_duckdb::Value_*,_std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>_>
                  ::operator*(&local_190);
      bVar2 = Value::IsNull(local_1a0);
      if (bVar2) break;
      Value::ToString_abi_cxx11_(in_stack_fffffffffffffc78);
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)in_stack_fffffffffffffbe0,(size_type)in_stack_fffffffffffffbd8);
      in_stack_fffffffffffffc28 =
           unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffbe0);
      local_211 = GetDateTypePartSpecifier(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
      local_220._M_cur =
           (__node_type *)
           ::std::
           unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffbd8,(key_type *)0x1ff406a);
      local_228._M_cur =
           (__node_type *)
           ::std::
           unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffbd8);
      bVar2 = ::std::__detail::operator!=(&local_220,&local_228);
      if (bVar2) {
        local_291 = 1;
        uVar5 = __cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_248,"Duplicate struct entry name \"%s\" in %s",&local_249);
        ::std::__cxx11::string::string(local_270,local_210);
        ::std::__cxx11::string::string(local_290,(string *)(local_18 + 8));
        BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                  ((BinderException *)in_stack_fffffffffffffc80,(string *)in_stack_fffffffffffffc78,
                   pbVar6,params_1);
        local_291 = 0;
        __cxa_throw(uVar5,&BinderException::typeinfo,BinderException::~BinderException);
      }
      pVar7 = ::std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(in_stack_fffffffffffffbf0,(value_type *)in_stack_fffffffffffffbe8);
      in_stack_fffffffffffffc00._M_cur =
           (__node_type *)
           pVar7.first.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur;
      local_2a0 = pVar7.second;
      local_2a8._M_cur = in_stack_fffffffffffffc00._M_cur;
      ::std::vector<duckdb::DatePartSpecifier,std::allocator<duckdb::DatePartSpecifier>>::
      emplace_back<duckdb::DatePartSpecifier_const&>
                ((vector<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_> *)
                 in_stack_fffffffffffffbf0,(DatePartSpecifier *)in_stack_fffffffffffffbe8);
      bVar2 = IsBigintDatepart(local_211);
      local_2a9 = !bVar2 * '\t' + '\x0e';
      ::std::make_pair<std::__cxx11::string_const&,duckdb::LogicalTypeId_const&>
                (&in_stack_fffffffffffffbe8->first,(LogicalTypeId *)in_stack_fffffffffffffbe0);
      ::std::
      vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
      ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalTypeId>>
                ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                  *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
      ::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalTypeId>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalTypeId>
               *)0x1ff42e2);
      ::std::__cxx11::string::~string(local_210);
      __gnu_cxx::
      __normal_iterator<const_duckdb::Value_*,_std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>_>
      ::operator++(&local_190);
    }
    local_1e9 = 1;
    uVar5 = __cxa_allocate_exception(0x10);
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)(local_1c1 + 1),"NULL struct entry name in %s",(allocator *)pbVar6);
    ::std::__cxx11::string::string(local_1e8,(string *)(local_18 + 8));
    BinderException::BinderException<std::__cxx11::string>
              (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,pbVar6);
    local_1e9 = 0;
    __cxa_throw(uVar5,&BinderException::typeinfo,BinderException::~BinderException);
  }
  local_179 = 1;
  msg = (string *)__cxa_allocate_exception(0x10);
  paVar8 = &local_151;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_150,"%s requires non-empty lists of part names",paVar8);
  ::std::__cxx11::string::string(local_178,(string *)(local_18 + 8));
  BinderException::BinderException<std::__cxx11::string>
            ((BinderException *)paVar8,msg,in_stack_fffffffffffffc40);
  local_179 = 0;
  __cxa_throw(msg,&BinderException::typeinfo,BinderException::~BinderException);
}

Assistant:

static unique_ptr<FunctionData> Bind(ClientContext &context, ScalarFunction &bound_function,
	                                     vector<unique_ptr<Expression>> &arguments) {
		// collect names and deconflict, construct return type
		if (arguments[0]->HasParameter()) {
			throw ParameterNotResolvedException();
		}
		if (!arguments[0]->IsFoldable()) {
			throw BinderException("%s can only take constant lists of part names", bound_function.name);
		}

		case_insensitive_set_t name_collision_set;
		child_list_t<LogicalType> struct_children;
		part_codes_t part_codes;

		Value parts_list = ExpressionExecutor::EvaluateScalar(context, *arguments[0]);
		if (parts_list.type().id() == LogicalTypeId::LIST) {
			auto &list_children = ListValue::GetChildren(parts_list);
			if (list_children.empty()) {
				throw BinderException("%s requires non-empty lists of part names", bound_function.name);
			}
			for (const auto &part_value : list_children) {
				if (part_value.IsNull()) {
					throw BinderException("NULL struct entry name in %s", bound_function.name);
				}
				const auto part_name = part_value.ToString();
				const auto part_code = GetDateTypePartSpecifier(part_name, arguments[1]->return_type);
				if (name_collision_set.find(part_name) != name_collision_set.end()) {
					throw BinderException("Duplicate struct entry name \"%s\" in %s", part_name, bound_function.name);
				}
				name_collision_set.insert(part_name);
				part_codes.emplace_back(part_code);
				const auto part_type = IsBigintDatepart(part_code) ? LogicalType::BIGINT : LogicalType::DOUBLE;
				struct_children.emplace_back(make_pair(part_name, part_type));
			}
		} else {
			throw BinderException("%s can only take constant lists of part names", bound_function.name);
		}

		Function::EraseArgument(bound_function, arguments, 0);
		bound_function.return_type = LogicalType::STRUCT(struct_children);
		return make_uniq<BindData>(bound_function.return_type, part_codes);
	}